

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

void __thiscall wasm::Literal::getBits(Literal *this,uint8_t (*buf) [16])

{
  char *pcVar1;
  
  *(uint8_t *)((long)buf + 0) = '\0';
  *(uint8_t *)((long)buf + 1) = '\0';
  *(uint8_t *)((long)buf + 2) = '\0';
  *(uint8_t *)((long)buf + 3) = '\0';
  *(uint8_t *)((long)buf + 4) = '\0';
  *(uint8_t *)((long)buf + 5) = '\0';
  *(uint8_t *)((long)buf + 6) = '\0';
  *(uint8_t *)((long)buf + 7) = '\0';
  *(uint8_t *)((long)buf + 8) = '\0';
  *(uint8_t *)((long)buf + 9) = '\0';
  *(uint8_t *)((long)buf + 10) = '\0';
  *(uint8_t *)((long)buf + 0xb) = '\0';
  *(uint8_t *)((long)buf + 0xc) = '\0';
  *(uint8_t *)((long)buf + 0xd) = '\0';
  *(uint8_t *)((long)buf + 0xe) = '\0';
  *(uint8_t *)((long)buf + 0xf) = '\0';
  switch((this->type).id) {
  case 0:
  case 1:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x1a0);
  case 2:
  case 4:
    *(int32_t *)*buf = (this->field_0).i32;
    break;
  case 3:
  case 5:
    *(int64_t *)*buf = (this->field_0).i64;
    break;
  case 6:
    pcVar1 = (this->field_0).func.super_IString.str._M_str;
    *(int64_t *)*buf = (this->field_0).i64;
    *(char **)(*buf + 8) = pcVar1;
    break;
  default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  return;
}

Assistant:

void Literal::getBits(uint8_t (&buf)[16]) const {
  memset(buf, 0, 16);
  switch (type.getBasic()) {
    case Type::i32:
    case Type::f32:
      memcpy(buf, &i32, sizeof(i32));
      break;
    case Type::i64:
    case Type::f64:
      memcpy(buf, &i64, sizeof(i64));
      break;
    case Type::v128:
      memcpy(buf, &v128, sizeof(v128));
      break;
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
}